

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

_Bool readInstruction32(uint8_t *code,size_t code_len,uint32_t *insn)

{
  uint32_t *insn_local;
  size_t code_len_local;
  uint8_t *code_local;
  
  if (3 < code_len) {
    *insn = *(uint32_t *)code;
  }
  return 3 < code_len;
}

Assistant:

static bool readInstruction32(const uint8_t *code, size_t code_len, uint32_t *insn)
{
	if (code_len < 4)
		// insufficient data
		return false;

	// Encoded as a little-endian 32-bit word in the stream.
	*insn = (code[0] << 0) | (code[1] << 8) | (code[2] << 16) | (code[3] << 24);
	return true;
}